

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message ** __thiscall
google::protobuf::internal::GeneratedMessageReflection::MutableField<google::protobuf::Message*>
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  OneofDescriptor *pOVar1;
  Message **ppMVar2;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pOVar1 = FieldDescriptor::containing_oneof(field);
  if (pOVar1 == (OneofDescriptor *)0x0) {
    SetBit(this,message,field);
  }
  else {
    SetOneofCase(this,message,field);
  }
  ppMVar2 = MutableRaw<google::protobuf::Message*>(this,message,field);
  return ppMVar2;
}

Assistant:

inline Type* GeneratedMessageReflection::MutableField(
    Message* message, const FieldDescriptor* field) const {
  field->containing_oneof() ?
      SetOneofCase(message, field) : SetBit(message, field);
  return MutableRaw<Type>(message, field);
}